

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O2

int main(void)

{
  Logger *this;
  EventLoop base_loop;
  EchoServer server;
  
  this = Logger::get_instance();
  Logger::init(this,(EVP_PKEY_CTX *)0x0);
  EventLoop::EventLoop(&base_loop);
  EchoServer::EchoServer(&server,&base_loop,"127.0.0.1",0x22b8);
  server.es_server.ts_tcp_conn_timout_ms = 8000;
  server.es_server.ts_thread_num = 2;
  TcpServer::start(&server.es_server);
  EventLoop::loop(&base_loop);
  TcpServer::~TcpServer(&server.es_server);
  EventLoop::~EventLoop(&base_loop);
  return 0;
}

Assistant:

int main()
{   
    Logger::get_instance()->init(NULL);

    EventLoop base_loop;
    EchoServer server(&base_loop, "127.0.0.1", 8888);
    server.set_tcp_cn_timeout_ms(8000);
    server.start(2);
    base_loop.loop();
    
    return 0;
}